

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMakeSubDirRegistering.cpp
# Opt level: O1

void __thiscall
proj2cmake::cmake::CMakeSubDirRegistering::operator()(CMakeSubDirRegistering *this,path *subDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  pointer pcVar3;
  pointer pcVar4;
  input_iterator_type OuterIt;
  pointer pcVar5;
  pointer pcVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  poVar2 = this->mOs;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"add_subdirectory(",0x11);
  paVar1 = &local_68.field_2;
  pcVar3 = (subDir->m_pathname)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (subDir->m_pathname)._M_string_length);
  boost::io::detail::quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
            (poVar2,&local_68,'&','\"');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pcVar5 = (subDir->m_pathname)._M_dataplus._M_p;
  sVar7 = (subDir->m_pathname)._M_string_length;
  pcVar3 = pcVar5 + sVar7;
  pcVar4 = pcVar3;
  pcVar6 = pcVar3;
  if (sVar7 != 0) {
    do {
      sVar7 = sVar7 - 1;
      sVar8 = 0;
      do {
        sVar9 = sVar8;
        if ((pcVar5[sVar8] != ".."[sVar8]) || (sVar9 = sVar8 + 1, sVar7 == sVar8)) break;
        bVar10 = sVar8 != 1;
        sVar8 = sVar9;
      } while (bVar10);
      pcVar4 = pcVar5 + sVar9;
      pcVar6 = pcVar5;
    } while ((sVar9 != 2) &&
            (pcVar5 = pcVar5 + 1, pcVar4 = pcVar3, pcVar6 = pcVar3, pcVar5 != pcVar3));
  }
  if (pcVar6 != pcVar4) {
    poVar2 = this->mOs;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    boost::filesystem::path::filename();
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_48,local_48 + local_40);
    boost::io::detail::quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
              (poVar2,&local_68,'&','\"');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
  }
  poVar2 = this->mOs;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void cmake::CMakeSubDirRegistering::operator()(const boost::filesystem::path& subDir)
{
   mOs << "add_subdirectory(" << subDir;

   if (boost::contains(subDir.string(), ".."))
   {
      mOs << " " << subDir.filename();
   }

   mOs << ")" << std::endl;
}